

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp_sint_t sexp_bignum_compare_abs(sexp a,sexp b)

{
  sexp_uint_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  sexp_uint_t sVar7;
  
  sVar1 = (a->value).string.offset;
  lVar4 = sVar1 * -0x100000000;
  do {
    uVar5 = sVar1;
    lVar6 = lVar4;
    if (uVar5 == 1) break;
    lVar4 = lVar6 + 0x100000000;
    sVar1 = uVar5 - 1;
  } while (*(long *)((long)&a->value + uVar5 * 8 + 8) == 0);
  sVar1 = (b->value).string.offset;
  lVar4 = sVar1 * -0x100000000 - lVar6;
  do {
    sVar7 = sVar1;
    lVar6 = lVar4;
    if (sVar7 == 1) break;
    lVar4 = lVar6 + 0x100000000;
    sVar1 = sVar7 - 1;
  } while (*(long *)((long)&b->value + sVar7 * 8 + 8) == 0);
  if ((int)uVar5 != (int)sVar7) {
    return lVar6 >> 0x20;
  }
  uVar5 = uVar5 & 0xffffffff;
  while( true ) {
    if ((int)uVar5 < 1) {
      return 0;
    }
    uVar2 = *(ulong *)((long)&a->value + uVar5 * 8 + 8);
    uVar3 = *(ulong *)((long)&b->value + uVar5 * 8 + 8);
    if (uVar3 < uVar2) break;
    uVar5 = uVar5 - 1;
    if (uVar2 < uVar3) {
      return -1;
    }
  }
  return 1;
}

Assistant:

sexp_sint_t sexp_bignum_compare_abs (sexp a, sexp b) {
  int ai=sexp_bignum_hi(a), bi=sexp_bignum_hi(b);
  sexp_uint_t *adata=sexp_bignum_data(a), *bdata=sexp_bignum_data(b);
  if (ai != bi)
    return ai - bi;
  for (--ai; ai >= 0; ai--) {
    if (adata[ai] > bdata[ai])
      return 1;
    else if (adata[ai] < bdata[ai])
      return -1;
  }
  return 0;
}